

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall TestSchema::test(TestSchema *this)

{
  std::operator<<((ostream *)&std::cout,"Before\n");
  avro::ValidSchema::toJson((ostream *)this);
  avro::ValidSchema::toFlatList((ostream *)this);
  buildSchema(this);
  std::operator<<((ostream *)&std::cout,"After\n");
  avro::ValidSchema::toJson((ostream *)this);
  avro::ValidSchema::toFlatList((ostream *)this);
  checkNameLookup(this);
  printEncoding(this);
  printValidatingEncoding(this,0);
  printValidatingEncoding(this,1);
  printValidatingEncoding(this,2);
  saveValidatingEncoding(this,1);
  readRawData(this);
  readValidatedData(this);
  createExampleSchema(this);
  return;
}

Assistant:

void test()
    {
        std::cout << "Before\n";
        schema_.toJson(std::cout);
        schema_.toFlatList(std::cout);
        buildSchema();
        std::cout << "After\n";
        schema_.toJson(std::cout);
        schema_.toFlatList(std::cout);

        checkNameLookup();

        printEncoding();
        printValidatingEncoding(0);
        printValidatingEncoding(1);
        printValidatingEncoding(2);

        saveValidatingEncoding(1);
        readRawData();
        readValidatedData();

        createExampleSchema();
    }